

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jieba.cc
# Opt level: O0

jieba_word_weight_t * jieba_extract_with_weight(jieba_t *handle,char *sentence,int top_k)

{
  jieba_word_weight_t *pjVar1;
  undefined4 in_EDX;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  *in_RSI;
  string *in_RDI;
  KeywordExtractor *unaff_retaddr;
  jieba_word_weight_t *res;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  words;
  allocator local_51;
  string local_50 [56];
  undefined4 in_stack_ffffffffffffffe8;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  *keywords;
  
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
            *)0x14f738);
  keywords = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,(char *)in_RSI,&local_51);
  cppjieba::KeywordExtractor::Extract
            (unaff_retaddr,in_RDI,keywords,CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  pjVar1 = convert_word_weights(in_RSI);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  ::~vector(in_RSI);
  return pjVar1;
}

Assistant:

jieba_word_weight_t* jieba_extract_with_weight(jieba_t* handle, const char* sentence, int top_k) {
  std::vector<std::pair<std::string, double> > words;
  ((cppjieba::Jieba*)handle)->extractor.Extract(sentence, words, top_k);
  jieba_word_weight_t* res = convert_word_weights(words);
  return res;
}